

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::lzham_lib_compress
          (lzham_compress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte_vec *this;
  ulong uVar4;
  uchar *puVar5;
  void *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  bool consumed_entire_input_buf;
  size_t bytes_to_put;
  size_t cMaxBytesToPutPerIteration;
  byte_vec *comp_data;
  lzham_compress_state *pState;
  undefined8 in_stack_ffffffffffffff60;
  vector<unsigned_char> *in_stack_ffffffffffffff68;
  ulong uVar6;
  ulong local_88;
  ulong local_80;
  undefined8 in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  lzcompressor *this_00;
  
  uVar3 = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if ((((in_RDI == 0) || (*(int *)(in_RDI + 0x5a26e0) == 0)) || (1 < *(uint *)(in_RDI + 0x5a26f8)))
     || ((in_RDX == (ulong *)0x0 || (in_R8 == (ulong *)0x0)))) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if ((*in_RDX != 0) && (in_RSI == 0)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if ((*in_R8 == 0) || (in_RCX == (void *)0x0)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  this = lzcompressor::get_compressed_data((lzcompressor *)(in_RDI + 0x2c8));
  this_00 = *(lzcompressor **)(in_RDI + 0x5a26d0);
  uVar2 = vector<unsigned_char>::size(this);
  if (this_00 < (lzcompressor *)(ulong)uVar2) {
    *in_RDX = 0;
    uVar3 = vector<unsigned_char>::size(this);
    if ((ulong)uVar3 - *(long *)(in_RDI + 0x5a26d0) < *in_R8) {
      uVar3 = vector<unsigned_char>::size(this);
      uVar4 = (ulong)uVar3 - *(long *)(in_RDI + 0x5a26d0);
    }
    else {
      uVar4 = *in_R8;
    }
    *in_R8 = uVar4;
    puVar5 = vector<unsigned_char>::get_ptr(this);
    memcpy(in_RCX,puVar5 + *(long *)(in_RDI + 0x5a26d0),*in_R8);
    *(ulong *)(in_RDI + 0x5a26d0) = *in_R8 + *(long *)(in_RDI + 0x5a26d0);
    *(undefined4 *)(in_RDI + 0x5a26f8) = 0;
    return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
  }
  vector<unsigned_char>::try_resize
            (in_stack_ffffffffffffff68,(uint)((ulong)in_stack_ffffffffffffff60 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff60 >> 0x18,0));
  *(undefined8 *)(in_RDI + 0x5a26d0) = 0;
  if ((*(byte *)(in_RDI + 0x5a26d8) & 1) != 0) {
    if ((*in_RDX == 0) && (in_R9D != 0)) {
      *in_RDX = 0;
      *in_R8 = 0;
      *(undefined4 *)(in_RDI + 0x5a26f8) = 2;
      return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
    }
    *(undefined4 *)(in_RDI + 0x5a26f8) = 5;
    return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
  }
  if (*in_RDX < 0x400001) {
    local_80 = *in_RDX;
  }
  else {
    local_80 = 0x400000;
  }
  uVar4 = *in_RDX;
  if ((local_80 != 0) &&
     (bVar1 = lzcompressor::put_bytes(this_00,in_stack_ffffffffffffff90,uVar3), !bVar1)) {
    *in_RDX = 0;
    *in_R8 = 0;
    *(undefined4 *)(in_RDI + 0x5a26f8) = 3;
    return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
  }
  if (((local_80 == uVar4) && (in_R9D != 0)) && ((*(byte *)(in_RDI + 0x5a26d8) & 1) == 0)) {
    bVar1 = lzcompressor::put_bytes(this_00,in_stack_ffffffffffffff90,uVar3);
    if (!bVar1) {
      *in_RDX = 0;
      *in_R8 = 0;
      *(undefined4 *)(in_RDI + 0x5a26f8) = 3;
      return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
    }
    *(undefined1 *)(in_RDI + 0x5a26d8) = 1;
  }
  *in_RDX = local_80;
  uVar3 = vector<unsigned_char>::size(this);
  if ((ulong)uVar3 - *(long *)(in_RDI + 0x5a26d0) < *in_R8) {
    uVar3 = vector<unsigned_char>::size(this);
    local_88 = (ulong)uVar3 - *(long *)(in_RDI + 0x5a26d0);
  }
  else {
    local_88 = *in_R8;
  }
  *in_R8 = local_88;
  if (*in_R8 != 0) {
    puVar5 = vector<unsigned_char>::get_ptr(this);
    memcpy(in_RCX,puVar5 + *(long *)(in_RDI + 0x5a26d0),*in_R8);
    *(ulong *)(in_RDI + 0x5a26d0) = *in_R8 + *(long *)(in_RDI + 0x5a26d0);
  }
  if ((in_R9D != 0) && ((*(byte *)(in_RDI + 0x5a26d8) & 1) != 0)) {
    uVar6 = *(ulong *)(in_RDI + 0x5a26d0);
    uVar3 = vector<unsigned_char>::size(this);
    if (uVar3 <= uVar6) {
      *(undefined4 *)(in_RDI + 0x5a26f8) = 2;
      goto LAB_00117c10;
    }
  }
  if (((local_80 == uVar4) && (in_R9D == 0)) &&
     (uVar4 = *(ulong *)(in_RDI + 0x5a26d0), uVar3 = vector<unsigned_char>::size(this),
     uVar3 <= uVar4)) {
    *(undefined4 *)(in_RDI + 0x5a26f8) = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x5a26f8) = 0;
  }
LAB_00117c10:
  return *(lzham_compress_status_t *)(in_RDI + 0x5a26f8);
}

Assistant:

lzham_compress_status_t lzham_lib_compress(
      lzham_compress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size, 
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (pState->m_status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((!*pOut_buf_size) || (!pOut_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      byte_vec &comp_data = pState->m_compressor.get_compressed_data();
      if (pState->m_comp_data_ofs < comp_data.size())
      {
         *pIn_buf_size = 0;
         *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);
                  
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);
         
         pState->m_comp_data_ofs += *pOut_buf_size;
         
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
         return pState->m_status;
      }
      
      comp_data.try_resize(0);
      pState->m_comp_data_ofs = 0;
      
      if (pState->m_flushed_compressor)
      {
         if ((*pIn_buf_size) || (!no_more_input_bytes_flag))
         {
            pState->m_status = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            return pState->m_status;
         }
         
         *pIn_buf_size = 0;
         *pOut_buf_size = 0;
         
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
         return pState->m_status;
      }
      
      const size_t cMaxBytesToPutPerIteration = 4*1024*1024;
      size_t bytes_to_put = LZHAM_MIN(cMaxBytesToPutPerIteration, *pIn_buf_size);
      const bool consumed_entire_input_buf = (bytes_to_put == *pIn_buf_size);

      if (bytes_to_put)
      {
         if (!pState->m_compressor.put_bytes(pIn_buf, (uint)bytes_to_put))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;
            
            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }
      }
      
      if ((consumed_entire_input_buf) && (no_more_input_bytes_flag) && (!pState->m_flushed_compressor))
      {
         if (!pState->m_compressor.put_bytes(NULL, 0))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;

            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }  
         pState->m_flushed_compressor = true;  
      }
                  
      *pIn_buf_size = bytes_to_put;
      
      *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);   
      if (*pOut_buf_size)
      {
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);

         pState->m_comp_data_ofs += *pOut_buf_size;
      }
      
      if ((no_more_input_bytes_flag) && (pState->m_flushed_compressor) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
      else if ((consumed_entire_input_buf) && (!no_more_input_bytes_flag) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
      else
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      
      return pState->m_status;  
   }